

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_fekete_rule.cpp
# Opt level: O2

void file_name_inc(char *file_name)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  
  uVar2 = s_len_trim(file_name);
  if ((int)uVar2 < 1) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"FILE_NAME_INC - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  Input file name is blank.\n");
    exit(1);
  }
  uVar3 = (ulong)uVar2;
  iVar4 = 0;
  while( true ) {
    do {
      if ((long)uVar3 < 1) {
        if (iVar4 == 0) {
          file_name[0] = ' ';
          file_name[1] = '\0';
        }
        return;
      }
      cVar1 = file_name[uVar3 - 1];
      uVar3 = uVar3 - 1;
    } while (9 < (byte)(cVar1 - 0x30U));
    if (cVar1 != '9') break;
    iVar4 = iVar4 + 1;
    file_name[uVar3] = '0';
  }
  file_name[uVar3] = cVar1 + '\x01';
  return;
}

Assistant:

void file_name_inc ( char *file_name )

//****************************************************************************80
//
//  Purpose:
//
//    FILE_NAME_INC increments a partially numeric file name.
//
//  Discussion:
//
//    It is assumed that the digits in the name, whether scattered or
//    connected, represent a number that is to be increased by 1 on
//    each call.  If this number is all 9's on input, the output number
//    is all 0's.  Non-numeric letters of the name are unaffected.
//
//    If the input string contains no digits, a blank string is returned.
//
//    If a blank string is input, then an error condition results.
//
//  Example:
//
//      Input            Output
//      -----            ------
//      "a7to11.txt"     "a7to12.txt"  (typical case.  Last digit incremented)
//      "a7to99.txt"     "a8to00.txt"  (last digit incremented, with carry.)
//      "a9to99.txt"     "a0to00.txt"  (wrap around)
//      "cat.txt"        " "           (no digits to increment)
//      " "              STOP!         (error)
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    14 September 2005
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input/output, character *FILE_NAME, (a pointer to) the character string
//    to be incremented.
//
{
  char c;
  int change;
  int i;
  int lens;

  lens = s_len_trim ( file_name );

  if ( lens <= 0 )
  {
    std::cerr << "\n";
    std::cerr << "FILE_NAME_INC - Fatal error!\n";
    std::cerr << "  Input file name is blank.\n";
    exit ( 1 );
  }

  change = 0;

  for ( i = lens-1; 0 <= i; i-- )
  {
    c = *(file_name+i);

    if ( '0' <= c && c <= '9' )
    {
      change = change + 1;
      if ( c == '9' )
      {
        c = '0';
        *(file_name+i) = c;
      }
      else
      {
        c = c + 1;
        *(file_name+i) = c;
        return;
      }
    }
  }

  if ( change == 0 )
  {
    strcpy ( file_name, " " );
  }

  return;
}